

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

Kit_Graph_t * Kit_GraphCreateLeaf(int iLeaf,int nLeaves,int fCompl)

{
  Kit_Graph_t *pKVar1;
  
  if ((-1 < iLeaf) && (iLeaf < nLeaves)) {
    pKVar1 = Kit_GraphCreate(nLeaves);
    pKVar1->eRoot =
         (Kit_Edge_t)((fCompl & 1U) + (iLeaf & 0x3fffffffU) * 2 | (uint)pKVar1->eRoot & 0x80000000);
    return pKVar1;
  }
  __assert_fail("0 <= iLeaf && iLeaf < nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitGraph.c"
                ,0x71,"Kit_Graph_t *Kit_GraphCreateLeaf(int, int, int)");
}

Assistant:

Kit_Graph_t * Kit_GraphCreateLeaf( int iLeaf, int nLeaves, int fCompl )   
{
    Kit_Graph_t * pGraph;
    assert( 0 <= iLeaf && iLeaf < nLeaves );
    pGraph = Kit_GraphCreate( nLeaves );
    pGraph->eRoot.Node   = iLeaf;
    pGraph->eRoot.fCompl = fCompl;
    return pGraph;
}